

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  ostream *this;
  size_type sVar3;
  reference pvVar4;
  long lVar5;
  string local_258 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [39];
  allocator local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [39];
  allocator local_101;
  string local_100 [32];
  int local_e0;
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [8];
  string arg;
  int local_8c;
  string local_88 [4];
  int i;
  string destination;
  undefined1 local_68 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sources;
  allocator local_39;
  string local_38 [32];
  char **local_18;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_18 = argv;
  argv_local._0_4_ = argc;
  if (argc < 3) {
    pcVar1 = *argv;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,pcVar1,&local_39);
    show_usage((string *)local_38);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    argv_local._4_4_ = 1;
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_68);
    std::__cxx11::string::string(local_88);
    for (local_8c = 1; local_8c < (int)argv_local; local_8c = local_8c + 1) {
      pcVar1 = local_18[local_8c];
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b0,pcVar1,&local_b1);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_b0,"-h");
      if ((bVar2) ||
         (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_b0,"--help"), bVar2)) {
        pcVar1 = *local_18;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_d8,pcVar1,&local_d9);
        show_usage((string *)local_d8);
        std::__cxx11::string::~string(local_d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_d9);
        argv_local._4_4_ = 0;
        local_e0 = 1;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_b0,"-t");
        if ((bVar2) ||
           (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_b0,"--type"), bVar2)) {
          if ((int)argv_local < 4) {
            pcVar1 = *local_18;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_100,pcVar1,&local_101);
            show_usage((string *)local_100);
            std::__cxx11::string::~string(local_100);
            std::allocator<char>::~allocator((allocator<char> *)&local_101);
            argv_local._4_4_ = 1;
            local_e0 = 1;
          }
          else {
            if (local_8c + 1 < (int)argv_local) {
              lVar5 = (long)local_8c;
              local_8c = local_8c + 1;
              std::__cxx11::string::operator=(local_88,local_18[lVar5 + 1]);
              goto LAB_00107e80;
            }
            this = std::operator<<((ostream *)&std::cerr,"--type option needs one argument.");
            std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
            argv_local._4_4_ = 1;
            local_e0 = 1;
          }
        }
        else {
          pcVar1 = local_18[local_8c];
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_128,pcVar1,&local_129);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_68,(value_type *)local_128);
          std::__cxx11::string::~string(local_128);
          std::allocator<char>::~allocator((allocator<char> *)&local_129);
LAB_00107e80:
          local_e0 = 0;
        }
      }
      std::__cxx11::string::~string(local_b0);
      if (local_e0 != 0) goto LAB_001083fc;
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_88,"");
    if (((bVar2) ||
        (sVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_68), sVar3 != 1)) ||
       ((bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_88,"0"), bVar2 &&
        (((bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_88,"1"), bVar2 &&
          (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_88,"2"), bVar2)) &&
         (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_88,"3"), bVar2)))))) {
      pcVar1 = *local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_150,pcVar1,&local_151);
      show_usage((string *)local_150);
      std::__cxx11::string::~string(local_150);
      std::allocator<char>::~allocator((allocator<char> *)&local_151);
      argv_local._4_4_ = 1;
      local_e0 = 1;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_88,"0");
      if (bVar2) {
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_68,0);
        std::__cxx11::string::string(local_178,(string *)pvVar4);
        encode((string *)local_178);
        std::__cxx11::string::~string(local_178);
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_88,"1");
        if (bVar2) {
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_68,0);
          std::__cxx11::string::string(local_198,(string *)pvVar4);
          decode((string *)local_198);
          std::__cxx11::string::~string(local_198);
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_88,"2");
          if (bVar2) {
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_68,0);
            std::__cxx11::string::string(local_1b8,(string *)pvVar4);
            encode((string *)local_1b8);
            std::__cxx11::string::~string(local_1b8);
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_68,0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_68,0);
            std::__cxx11::string::size();
            std::__cxx11::string::substr((ulong)local_1f8,(ulong)pvVar4);
            std::operator+(local_1d8,(char *)local_1f8);
            decode(local_1d8);
            std::__cxx11::string::~string((string *)local_1d8);
            std::__cxx11::string::~string(local_1f8);
          }
          else {
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_68,0);
            std::__cxx11::string::string(local_218,(string *)pvVar4);
            encodeImagePackBits((string *)local_218);
            std::__cxx11::string::~string(local_218);
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_68,0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_68,0);
            std::__cxx11::string::size();
            std::__cxx11::string::substr((ulong)local_258,(ulong)pvVar4);
            std::operator+(local_238,(char *)local_258);
            decodeImagePackBits(local_238);
            std::__cxx11::string::~string((string *)local_238);
            std::__cxx11::string::~string(local_258);
          }
        }
      }
      argv_local._4_4_ = 0;
      local_e0 = 1;
    }
LAB_001083fc:
    std::__cxx11::string::~string(local_88);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_68);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
    if (argc < 3)
    {
        show_usage(argv[0]);
        return 1;
    }
    std::vector <std::string> sources;
    std::string destination;

    for (int i = 1; i < argc; ++i) {
        std::string arg = argv[i];
        if ((arg == "-h") || (arg == "--help")) {
            show_usage(argv[0]);
            return 0;
        } else if ((arg == "-t") || (arg == "--type")) {
            if (argc < 4)
            {
                show_usage(argv[0]);
                return 1;
            }
            if (i + 1 < argc) {                                     // Make sure we aren't at the end of argv!
                destination = argv[++i];
            } else {
                  std::cerr << "--type option needs one argument." << std::endl;
                return 1;
            }
        } else {
            sources.push_back(argv[i]);
        }
    }
    if (destination == "" || sources.size() != 1 || (destination != "0" && destination != "1" && destination != "2" && destination != "3"))
    {
        show_usage(argv[0]);
        return 1;
    }
    /*
    0 - encode image
    1 - decode image
    2 - encode and decode image
    3 - encode and decode image with the PackBits algorithm
    */
    if (destination == "0")
            encode(sources[0]);
    else if (destination == "1")
            decode(sources[0]);
    else if (destination == "2")
    {
        encode(sources[0]);
        decode(sources[0].substr(0, sources[0].size()-4) + ".rle");
    }
    else
    {
        encodeImagePackBits(sources[0]);
        decodeImagePackBits(sources[0].substr(0, sources[0].size()-4) + "_packbits.rle");
    }

    return 0;
}